

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O3

uint * Amap_LibVerifyPerm_rec
                 (Amap_Lib_t *pLib,Amap_Nod_t *pNod,Vec_Ptr_t *vTtElems,Vec_Int_t *vTruth,int nWords
                 ,int *piInput)

{
  ushort uVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  uint *puVar6;
  char *__function;
  ulong uVar7;
  char *__file;
  char *__assertion;
  
  if ((*(uint *)pNod & 0xff000000) == 0x6000000) {
    __assertion = "pNod->Type != AMAP_OBJ_MUX";
    __file = 
    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
    ;
    __function = 
    "unsigned int *Amap_LibVerifyPerm_rec(Amap_Lib_t *, Amap_Nod_t *, Vec_Ptr_t *, Vec_Int_t *, int, int *)"
    ;
LAB_003ca904:
    __assert_fail(__assertion,__file,0xf3,__function);
  }
  if ((short)*(uint *)pNod == 0) {
    iVar2 = *piInput;
    *piInput = iVar2 + 1;
    if ((-1 < (long)iVar2) && (iVar2 < vTtElems->nSize)) {
      return (uint *)vTtElems->pArray[iVar2];
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (-1 < pNod->iFan0) {
    puVar3 = Amap_LibVerifyPerm_rec
                       (pLib,(Amap_Nod_t *)
                             (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan0 >> 1) * 0x18),
                        vTtElems,vTruth,nWords,piInput);
    if (-1 < pNod->iFan1) {
      puVar4 = Amap_LibVerifyPerm_rec
                         (pLib,(Amap_Nod_t *)
                               (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan1 >> 1) * 0x18),
                          vTtElems,vTruth,nWords,piInput);
      if (nWords == 0) {
        puVar6 = (uint *)0x0;
        if (pNod->field_0x3 == '\x05') {
          return (uint *)0x0;
        }
      }
      else {
        if (nWords < 1) {
          __assert_fail("nWords > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x39a,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
        }
        lVar5 = (long)nWords + (long)vTruth->nSize;
        iVar2 = (int)lVar5;
        vTruth->nSize = iVar2;
        if (vTruth->nCap < iVar2) {
          puVar6 = (uint *)0x0;
        }
        else {
          puVar6 = (uint *)(vTruth->pArray + (lVar5 - (ulong)(uint)nWords));
        }
        if (pNod->field_0x3 == '\x05') {
          uVar7 = 0;
          do {
            puVar6[uVar7] = puVar4[uVar7] ^ puVar3[uVar7];
            uVar7 = uVar7 + 1;
          } while ((uint)nWords != uVar7);
          return puVar6;
        }
      }
      if (-1 < pNod->iFan0) {
        uVar1 = pNod->iFan1;
        if ((pNod->iFan0 & 1U) == 0) {
          if (-1 < (short)uVar1) {
            if ((uVar1 & 1) == 0) {
              if (nWords != 0) {
                uVar7 = 0;
                do {
                  puVar6[uVar7] = puVar4[uVar7] & puVar3[uVar7];
                  uVar7 = uVar7 + 1;
                } while ((uint)nWords != uVar7);
              }
            }
            else if (nWords != 0) {
              uVar7 = 0;
              do {
                puVar6[uVar7] = ~puVar4[uVar7] & puVar3[uVar7];
                uVar7 = uVar7 + 1;
              } while ((uint)nWords != uVar7);
            }
            return puVar6;
          }
        }
        else if (-1 < (short)uVar1) {
          if ((uVar1 & 1) != 0) {
            if (nWords == 0) {
              return puVar6;
            }
            uVar7 = 0;
            do {
              puVar6[uVar7] = ~(puVar4[uVar7] | puVar3[uVar7]);
              uVar7 = uVar7 + 1;
            } while ((uint)nWords != uVar7);
            return puVar6;
          }
          if (nWords == 0) {
            return puVar6;
          }
          uVar7 = 0;
          do {
            puVar6[uVar7] = ~puVar3[uVar7] & puVar4[uVar7];
            uVar7 = uVar7 + 1;
          } while ((uint)nWords != uVar7);
          return puVar6;
        }
      }
      __assertion = "Lit >= 0";
      __file = 
      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
      ;
      __function = "int Abc_LitIsCompl(int)";
      goto LAB_003ca904;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

unsigned * Amap_LibVerifyPerm_rec( Amap_Lib_t * pLib, Amap_Nod_t * pNod, 
    Vec_Ptr_t * vTtElems, Vec_Int_t * vTruth, int nWords, int * piInput )
{
    Amap_Nod_t * pFan0, * pFan1;
    unsigned * pTruth0, * pTruth1, * pTruth;
    int i;
    assert( pNod->Type != AMAP_OBJ_MUX );
    if ( pNod->Id == 0 )
        return (unsigned *)Vec_PtrEntry( vTtElems, (*piInput)++ );
    pFan0 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
    pTruth0 = Amap_LibVerifyPerm_rec( pLib, pFan0, vTtElems, vTruth, nWords, piInput );
    pFan1 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
    pTruth1 = Amap_LibVerifyPerm_rec( pLib, pFan1, vTtElems, vTruth, nWords, piInput );
    pTruth  = Vec_IntFetch( vTruth, nWords );
    if ( pNod->Type == AMAP_OBJ_XOR )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Abc_LitIsCompl(pNod->iFan0) && !Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Abc_LitIsCompl(pNod->iFan0) && Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Abc_LitIsCompl(pNod->iFan0) && !Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Abc_LitIsCompl(pNod->iFan0) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    return pTruth;
}